

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O1

void dump_catch_menus(boolean intercept)

{
  if (intercept != '\0') {
    windowprocs.win_display_menu = dump_display_menu;
    windowprocs.win_display_objects = dump_display_objects;
    windowprocs.win_outrip = dump_outrip;
    return;
  }
  memcpy(&windowprocs,&winprocs_original,0x90);
  return;
}

Assistant:

void dump_catch_menus(boolean intercept)
{
    if (!intercept) {
	windowprocs = winprocs_original;
	return;
    }
	
    windowprocs.win_display_menu = dump_display_menu;
    windowprocs.win_display_objects = dump_display_objects;
    windowprocs.win_outrip = dump_outrip;
}